

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

bool duckdb::Time::IsValidTime(int32_t hour,int32_t minute,int32_t second,int32_t microseconds)

{
  if (0x17 < (uint)hour) {
    return ((second == 0 && minute == 0) && microseconds == 0) && hour == 0x18;
  }
  return (uint)microseconds < 0xf4241 && ((uint)second < 0x3d && (uint)minute < 0x3c);
}

Assistant:

bool Time::IsValidTime(int32_t hour, int32_t minute, int32_t second, int32_t microseconds) {
	if (hour < 0 || hour >= 24) {
		return (hour == 24) && (minute == 0) && (second == 0) && (microseconds == 0);
	}
	if (minute < 0 || minute >= 60) {
		return false;
	}
	if (second < 0 || second > 60) {
		return false;
	}
	if (microseconds < 0 || microseconds > 1000000) {
		return false;
	}
	return true;
}